

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU
          (ModelBaseEKFFlexEstimatorIMU *this,double dt)

{
  ExtendedKalmanFilter *this_00;
  IMUElasticLocalFrameDynamicalSystem *this_01;
  Vector *this_02;
  _func_int **pp_Var1;
  double *pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  int iVar7;
  Index size;
  Index IVar8;
  uint extraout_var;
  double *pdVar9;
  undefined8 *puVar10;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar11;
  Index index_2;
  char *__function;
  Index index;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ActualDstType actualDst;
  Vector dx;
  Vector x0;
  Vector3 v2;
  Vector3 v1;
  DenseStorage<double,__1,__1,_1,_0> local_118;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_100;
  Matrix *local_e0;
  ObserverBase local_d8;
  DenseStorage<double,__1,__1,_1,_0> local_b8;
  Matrix<double,_3,_1,_0,_3,_1> local_a8;
  Matrix<double,_3,_1,_0,_3,_1> local_90;
  undefined1 local_78 [24];
  long lStack_60;
  variable_if_dynamic<long,__1> local_58;
  variable_if_dynamic<long,__1> local_50;
  scalar_constant_op<double> local_48;
  
  lStack_60 = local_78._16_8_;
  local_78._0_8_ = 0x23;
  local_78._8_8_ = 1;
  local_78._16_8_ = 0x3e45798ee2308c3a;
  local_e0 = (Matrix *)dt;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_100,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_78);
  EKFFlexibilityEstimatorBase::EKFFlexibilityEstimatorBase
            (&this->super_EKFFlexibilityEstimatorBase,0x23,0xc,0x30,(Vector *)&local_100);
  free(local_100.m_xpr);
  (this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
  _vptr_FlexibilityEstimatorBase = (_func_int **)&PTR__ModelBaseEKFFlexEstimatorIMU_001b62f8;
  this_01 = &this->functor_;
  IMUElasticLocalFrameDynamicalSystem::IMUElasticLocalFrameDynamicalSystem(this_01,(double)local_e0)
  ;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  this->stateSize_ = 0x23;
  this->unmodeledForceVariance_ = 1e-06;
  local_78._8_8_ = 6;
  local_78._16_8_ = 6;
  local_58.m_value = 6;
  local_50.m_value = 6;
  local_48.m_other = 0.0001;
  (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->forceVariance_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
            (&this->forceVariance_,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_78,(assign_op<double,_double> *)&local_100);
  this->absPosVariance_ = 0.0001;
  this->useFTSensors_ = false;
  this->withAbsolutePos_ = false;
  this->withComBias_ = false;
  this->withUnmodeledForces_ = false;
  this->limitOn_ = true;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).O.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->op_).CA.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  local_e0 = &this->forceVariance_;
  IVar8 = IMUElasticLocalFrameDynamicalSystem::getMeasurementSize(this_01);
  this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
  KalmanFilterBase::setMeasureSize(&this_00->super_KalmanFilterBase,IVar8);
  KalmanFilterBase::setStateSize(&this_00->super_KalmanFilterBase,this->stateSize_);
  IVar8 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_01);
  ZeroDelayObserver::setInputSize((ZeroDelayObserver *)this_00,IVar8);
  IVar8 = IMUElasticLocalFrameDynamicalSystem::getInputSize(this_01);
  this->inputSize_ = IVar8;
  resetCovarianceMatrices(this);
  iVar7 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x13])();
  uVar12 = CONCAT44(extraout_var,iVar7);
  if ((int)extraout_var < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  pdVar9 = local_118.m_data;
  uVar15 = local_118.m_rows;
  if (uVar12 != 0) {
    free((void *)0x0);
    uVar15 = uVar12;
    if (uVar12 == 0) {
      pdVar9 = (double *)0x0;
    }
    else {
      if (extraout_var >> 0x1d != 0) {
LAB_0014d39b:
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = operator_delete;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      pdVar9 = (double *)malloc(uVar12 * 8);
      if (uVar12 != 1 && ((ulong)pdVar9 & 0xf) != 0) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                      "void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (pdVar9 == (double *)0x0) goto LAB_0014d39b;
    }
  }
  local_118.m_rows = uVar15;
  local_118.m_data = pdVar9;
  if (local_118.m_rows != uVar12) {
    __function = 
    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
    ;
LAB_0014d8b7:
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,__function);
  }
  uVar12 = local_118.m_rows - (local_118.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_118.m_rows) {
    lVar14 = 0;
    do {
      local_118.m_data[lVar14] = 1e-08;
      (local_118.m_data + lVar14)[1] = 1e-08;
      lVar14 = lVar14 + 2;
    } while (lVar14 < (long)uVar12);
  }
  if ((long)uVar12 < local_118.m_rows) {
    do {
      local_118.m_data[uVar12] = 1e-08;
      uVar12 = uVar12 + 1;
    } while (local_118.m_rows != uVar12);
  }
  if (5 < local_118.m_rows) {
    pdVar9 = local_118.m_data + 3;
    uVar12 = 3;
    if (((ulong)pdVar9 & 7) == 0) {
      uVar12 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
    }
    uVar13 = (uint)uVar12 ^ 3;
    if (uVar12 != 0) {
      uVar15 = 0;
      do {
        pdVar9[uVar15] = 0.0001;
        uVar15 = uVar15 + 1;
      } while (uVar12 != uVar15);
    }
    uVar15 = (uVar13 & 0xfffffffe) + uVar12;
    if (1 < uVar13) {
      do {
        pdVar9[uVar12] = 0.0001;
        (pdVar9 + uVar12)[1] = 0.0001;
        uVar12 = uVar12 + 2;
      } while (uVar12 < uVar15);
    }
    if ((uint)uVar15 < 3) {
      do {
        pdVar9[uVar15] = 0.0001;
        uVar15 = uVar15 + 1;
      } while (uVar15 != 3);
    }
    if (0xb < local_118.m_rows) {
      pdVar9 = local_118.m_data + 9;
      uVar12 = 3;
      if (((ulong)pdVar9 & 7) == 0) {
        uVar12 = (ulong)((uint)((ulong)pdVar9 >> 3) & 1);
      }
      uVar13 = (uint)uVar12 ^ 3;
      if (uVar12 != 0) {
        uVar15 = 0;
        do {
          pdVar9[uVar15] = 0.0001;
          uVar15 = uVar15 + 1;
        } while (uVar12 != uVar15);
      }
      uVar15 = (uVar13 & 0xfffffffe) + uVar12;
      if (1 < uVar13) {
        do {
          pdVar9[uVar12] = 0.0001;
          (pdVar9 + uVar12)[1] = 0.0001;
          uVar12 = uVar12 + 2;
        } while (uVar12 < uVar15);
      }
      if ((uint)uVar15 < 3) {
        do {
          pdVar9[uVar15] = 0.0001;
          uVar15 = uVar15 + 1;
        } while (uVar15 != 3);
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_b8,&local_118);
      EKFFlexibilityEstimatorBase::useFiniteDifferencesJacobians
                (&this->super_EKFFlexibilityEstimatorBase,(Vector *)&local_b8);
      free(local_b8.m_data);
      ObserverBase::stateVectorZero(&local_d8);
      pp_Var6 = local_d8._vptr_ObserverBase;
      this_02 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
      if ((this->super_EKFFlexibilityEstimatorBase).lastX_.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          local_d8.n_) {
        if (local_d8.n_ < 0) {
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize
                  ((DenseStorage<double,__1,__1,_1,_0> *)this_02,local_d8.n_,local_d8.n_,1);
      }
      uVar12 = (this->super_EKFFlexibilityEstimatorBase).lastX_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (uVar12 == local_d8.n_) {
        pdVar9 = (this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        uVar15 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < (long)uVar12) {
          lVar14 = 0;
          do {
            pp_Var1 = pp_Var6 + lVar14;
            p_Var5 = pp_Var1[1];
            pdVar2 = pdVar9 + lVar14;
            *pdVar2 = (double)*pp_Var1;
            pdVar2[1] = (double)p_Var5;
            lVar14 = lVar14 + 2;
          } while (lVar14 < (long)uVar15);
        }
        if ((long)uVar15 < (long)uVar12) {
          do {
            pdVar9[uVar15] = (double)pp_Var6[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar12 != uVar15);
        }
        ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_d8,0);
        KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&this->Q_);
        ExtendedKalmanFilter::setFunctor(this_00,&this_01->super_DynamicalSystemFunctorBase);
        IMUElasticLocalFrameDynamicalSystem::setFDstep
                  (this_01,&(this->super_EKFFlexibilityEstimatorBase).dx_);
        this->on_ = true;
        local_100.m_xpr = &local_90;
        local_100.m_row = 0;
        local_100.m_col = 1;
        local_100.m_currentBlockRows = 1;
        local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
        [0] = 100.0;
        local_d8.p_ = 0x4059000000000000;
        pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                            (&local_100,(Scalar *)&local_d8.p_);
        local_d8.m_ = 0x408f400000000000;
        Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                  (pCVar11,(Scalar *)&local_d8.m_);
        if ((local_100.m_currentBlockRows + local_100.m_row == 3) && (local_100.m_col == 1)) {
          local_100.m_xpr = &local_a8;
          local_100.m_row = 0;
          local_100.m_col = 1;
          local_100.m_currentBlockRows = 1;
          local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = 10.0;
          local_d8.p_ = 0x4024000000000000;
          pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                              (&local_100,(Scalar *)&local_d8.p_);
          local_d8.m_ = 0x4059000000000000;
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                    (pCVar11,(Scalar *)&local_d8.m_);
          if ((local_100.m_currentBlockRows + local_100.m_row == 3) && (local_100.m_col == 1)) {
            local_78._0_8_ = 0;
            local_78._8_8_ = 0;
            unique0x100003de = 0;
            unique0x100003d2 = ZEXT812(0x4081651eb851eb85);
            (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[0] =
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 0.0 +
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 0.0 +
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 556.64;
            (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[1] =
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 0.0 +
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 556.64 +
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 0.0;
            (this->limitForces_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] =
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 556.64 +
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 0.0 +
                 local_90.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 0.0;
            dVar4 = local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[2] * 0.0 +
                    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1] * 556.64 +
                    local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[0] * 0.0;
            auVar3._8_4_ = SUB84(dVar4,0);
            auVar3._0_8_ = local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[2] * 0.0 +
                           local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[1] * 0.0 +
                           local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                           m_storage.m_data.array[0] * 556.64;
            auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
            *(undefined1 (*) [16])
             (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array = auVar3;
            (this->limitTorques_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
            m_storage.m_data.array[2] =
                 local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2] * 556.64 +
                 local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[1] * 0.0 +
                 local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[0] * 0.0;
            free(local_d8._vptr_ObserverBase);
            free(local_118.m_data);
            return;
          }
        }
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
                     );
      }
      __function = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
      goto LAB_0014d8b7;
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

ModelBaseEKFFlexEstimatorIMU::ModelBaseEKFFlexEstimatorIMU(double dt)
: EKFFlexibilityEstimatorBase(stateSize,
                              measurementSizeBase_,
                              inputSizeBase_,
                              Matrix::Constant(stateSize, 1, dxFactor)),
  functor_(dt), stateSize_(stateSize), unmodeledForceVariance_(1e-6), forceVariance_(Matrix::Identity(6, 6) * 1e-4),
  absPosVariance_(1e-4), useFTSensors_(false), withAbsolutePos_(false), withComBias_(false),
  withUnmodeledForces_(false), limitOn_(true)
{
  ekf_.setMeasureSize(functor_.getMeasurementSize());
  ekf_.setStateSize(stateSize_);
  ekf_.setInputSize(functor_.getInputSize());
  inputSize_ = functor_.getInputSize();

  ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices();

  Vector dx(Matrix::Constant(getStateSize(), 1, dxFactor));

  dx.segment(state::ori, 3).fill(1e-4);
  dx.segment(state::angVel, 3).fill(1e-4);

  ModelBaseEKFFlexEstimatorIMU::useFiniteDifferencesJacobians(dx);

  Vector x0(ekf_.stateVectorZero());

  lastX_ = x0;
  ekf_.setState(x0, 0);

  ekf_.setStateCovariance(Q_);

  ekf_.setFunctor(&functor_);

  functor_.setFDstep(dx_);

  on_ = true;

  Vector3 v1, v2;
  Matrix3 v;
  v1 << 100, 100, 1000;
  v2 << 10, 10, 100;
  v.setIdentity();
  v *= cst::gravityConstant * hrp2::m;
  limitForces_ = v * v1;
  limitTorques_ = v * v2;
}